

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O0

string * ApprovalTests::TestName::getMisconfiguredBuildHelp(string *fileName)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *in_stack_00000028;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30 [48];
  
  __lhs = &local_50;
  HelpMessages::getMisconfiguredBuildHelp(in_stack_00000028);
  ::std::operator+((char *)__lhs,in_RDI);
  ::std::operator+(__lhs,(char *)in_RDI);
  ::std::__cxx11::string::~string(local_30);
  ::std::__cxx11::string::~string((string *)&local_50);
  return in_RDI;
}

Assistant:

std::string TestName::getMisconfiguredBuildHelp(const std::string& fileName)
    {
        return "\n\n" + HelpMessages::getMisconfiguredBuildHelp(fileName) + "\n\n";
    }